

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O0

void __thiscall rsg::VariableType::VariableType(VariableType *this,VariableType *other)

{
  VariableType *other_local;
  VariableType *this_local;
  
  std::__cxx11::string::string((string *)&this->m_typeName);
  this->m_elementType = (VariableType *)0x0;
  std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::vector
            (&this->m_members);
  operator=(this,other);
  return;
}

Assistant:

VariableType::VariableType (const VariableType& other)
	: m_elementType(DE_NULL)
{
	*this = other;
}